

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

void __thiscall MinVR::element::~element(element *this)

{
  list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *this_00;
  attribute *this_01;
  _List_node_base *p_Var1;
  element *peVar2;
  
  if (this->name_is_allocated == true) {
    free(this->m_name);
  }
  peVar2 = this;
  if (this->is_empty_attribute_list == false) {
    while( true ) {
      peVar2 = (element *)
               (peVar2->m_attribute_list).
               super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      (this->it)._M_node = (_List_node_base *)peVar2;
      if (peVar2 == this) break;
      this_01 = (attribute *)
                (peVar2->m_attribute_list).
                super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
                _M_node._M_size;
      if (this_01 != (attribute *)0x0) {
        attribute::~attribute(this_01);
      }
      operator_delete(this_01,0x18);
      peVar2 = (element *)(this->it)._M_node;
    }
  }
  this_00 = &this->m_element_list;
  p_Var1 = (_List_node_base *)this_00;
  while( true ) {
    p_Var1 = (((_List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)&p_Var1->_M_next)
             ->_M_impl)._M_node.super__List_node_base._M_next;
    (this->i)._M_node = p_Var1;
    if (p_Var1 == (_List_node_base *)this_00) break;
    peVar2 = (element *)p_Var1[1]._M_next;
    if (peVar2 != (element *)0x0) {
      ~element(peVar2);
    }
    operator_delete(peVar2,0xb0);
    p_Var1 = (this->i)._M_node;
  }
  std::__cxx11::string::~string((string *)&this->m_value);
  std::__cxx11::_List_base<char_*,_std::allocator<char_*>_>::_M_clear
            (&(this->m_comment_list).super__List_base<char_*,_std::allocator<char_*>_>);
  std::__cxx11::_List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>::_M_clear
            (&this_00->super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>);
  std::__cxx11::_List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::_M_clear
            ((_List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)this);
  return;
}

Assistant:

element::~element()
{
    //if(value_is_allocated)
        //free(m_value);
    if(name_is_allocated)
        free(m_name);
    if(is_empty_attribute_list == false)
    {
        it = m_attribute_list.begin();
        while(it != m_attribute_list.end())
        {
            delete(*it);
            it++;
        }
    }
    i = m_element_list.begin();
    while(i != m_element_list.end())
    {
        delete(*i);
        i++;
    }
}